

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

string * __thiscall
pfederc::ArrayLitExpr::toString_abi_cxx11_(string *__return_storage_ptr__,ArrayLitExpr *this)

{
  _List_node_base *p_Var1;
  list<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
  *plVar2;
  long *local_50 [2];
  long local_40 [2];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"[","");
  p_Var1 = (this->exprs).
           super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  plVar2 = &this->exprs;
  if (p_Var1 != (_List_node_base *)plVar2) {
    do {
      if (p_Var1 != (plVar2->
                    super__List_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
                    )._M_impl._M_node.super__List_node_base._M_next) {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      (**(code **)((long)(p_Var1[1]._M_next)->_M_next + 0x10))(local_50);
      std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
      }
      p_Var1 = p_Var1->_M_next;
    } while (p_Var1 != (_List_node_base *)plVar2);
  }
  std::__cxx11::string::push_back((char)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string ArrayLitExpr::toString() const noexcept {
  std::string result = "[";
  for (auto it = exprs.begin(); it != exprs.end(); ++it) {
    if (it != exprs.begin())
      result += ", ";

    result += (*it)->toString();
  }

  result += ']';

  return result;
}